

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O2

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::ReceiveRequest(ZmqReqRep *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar3;
  int bytes;
  
  iVar1 = zmq_recv(*(undefined8 *)(in_RSI + 0x28),*(long *)(in_RSI + 8),
                   *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 8),0);
  if (iVar1 < 1) {
    *(undefined8 *)this = 0;
    (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<std::vector<char,std::allocator<char>>,int&>(&this->m_Timeout);
    memcpy((void *)**(undefined8 **)this,*(void **)(in_RSI + 8),(long)iVar1);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar3.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::ReceiveRequest()
{
    int bytes = zmq_recv(m_Socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
    if (bytes <= 0)
    {
        return nullptr;
    }
    auto request = std::make_shared<std::vector<char>>(bytes);
    std::memcpy(request->data(), m_ReceiverBuffer.data(), bytes);
    return request;
}